

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O2

void nivalis::anon_unknown_3::skip_ast(ASTNode **ast)

{
  uint32_t opcode;
  size_t sVar1;
  bool bVar2;
  
  opcode = (*ast)->opcode;
  sVar1 = OpCode::n_args(opcode);
  if (opcode == 0xc) {
    sVar1 = (size_t)((*ast)->field_1).call_info[1];
  }
  *ast = *ast + 1;
  while (bVar2 = sVar1 != 0, sVar1 = sVar1 - 1, bVar2) {
    skip_ast(ast);
  }
  return;
}

Assistant:

void skip_ast(const Expr::ASTNode** ast) {
    const auto* init_pos = ast;
    auto opc = (*ast)->opcode;
    size_t n_args = OpCode::n_args(opc);
    if (opc == OpCode::call) {
        n_args = (*ast)->call_info[1];
    }
    ++*ast;
    for (size_t i = 0; i < n_args; ++i) skip_ast(ast);
}